

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O2

void sinfl_build(uint *tbl,uchar *lens,int tbl_bits,int maxlen,int symcnt)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  ushort *puVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  int cnt [16];
  int off [16];
  short sort [288];
  
  cnt[0xc] = 0;
  cnt[0xd] = 0;
  cnt[0xe] = 0;
  cnt[0xf] = 0;
  cnt[8] = 0;
  cnt[9] = 0;
  cnt[10] = 0;
  cnt[0xb] = 0;
  cnt[4] = 0;
  cnt[5] = 0;
  cnt[6] = 0;
  cnt[7] = 0;
  cnt[0] = 0;
  cnt[1] = 0;
  cnt[2] = 0;
  cnt[3] = 0;
  off[0xc] = 0;
  off[0xd] = 0;
  off[0xe] = 0;
  off[0xf] = 0;
  off[8] = 0;
  off[9] = 0;
  off[10] = 0;
  off[0xb] = 0;
  off[4] = 0;
  off[5] = 0;
  off[6] = 0;
  off[7] = 0;
  off[0] = 0;
  off[1] = 0;
  off[2] = 0;
  off[3] = 0;
  uVar3 = 0;
  uVar15 = (ulong)(uint)symcnt;
  if (symcnt < 1) {
    uVar15 = uVar3;
  }
  for (; uVar15 != uVar3; uVar3 = uVar3 + 1) {
    cnt[lens[uVar3]] = cnt[lens[uVar3]] + 1;
  }
  off[1] = cnt[0];
  iVar2 = 0;
  for (lVar9 = 1; lVar9 < maxlen; lVar9 = lVar9 + 1) {
    iVar7 = cnt[lVar9];
    off[lVar9 + 1] = off[lVar9] + iVar7;
    iVar2 = iVar7 + iVar2 * 2;
  }
  iVar7 = cnt[lVar9];
  for (uVar3 = 0; uVar15 != uVar3; uVar3 = uVar3 + 1) {
    iVar16 = off[lens[uVar3]];
    off[lens[uVar3]] = iVar16 + 1;
    sort[iVar16] = (short)uVar3;
  }
  bVar4 = (byte)tbl_bits;
  if (iVar7 + iVar2 * 2 < 1 << ((byte)maxlen & 0x1f)) {
    for (lVar9 = 0; (uint)lVar9 >> (bVar4 & 0x1f) == 0; lVar9 = lVar9 + 1) {
      tbl[lVar9] = 1;
    }
  }
  else {
    puVar12 = (ushort *)(sort + off[0]);
    uVar15 = 0;
    do {
      iVar2 = cnt[uVar15 + 1];
      uVar15 = uVar15 + 1;
    } while (iVar2 == 0);
    iVar7 = 1 << ((byte)uVar15 & 0x1f);
    uVar13 = 0;
    while( true ) {
      uVar14 = (uint)uVar15;
      iVar16 = tbl_bits - uVar14;
      if (tbl_bits < (int)uVar14) break;
      do {
        tbl[(int)uVar13] = (uint)*puVar12 << 0x10 | uVar14;
        if (uVar13 == iVar7 - 1U) {
          while (bVar17 = iVar16 != 0, iVar16 = iVar16 + -1, bVar17) {
            memcpy(tbl + iVar7,tbl,(long)iVar7 * 4);
            iVar7 = iVar7 * 2;
          }
          return;
        }
        puVar12 = puVar12 + 1;
        uVar5 = uVar13 ^ iVar7 - 1U;
        uVar6 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar13 = uVar13 & (1 << ((byte)uVar6 & 0x1f)) - 1U | 1 << (uVar6 & 0x1f);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      uVar15 = (ulong)(int)uVar14;
      do {
        if ((long)uVar15 < (long)tbl_bits) {
          memcpy(tbl + iVar7,tbl,(long)iVar7 * 4);
          iVar7 = iVar7 * 2;
        }
        iVar2 = cnt[uVar15 + 1];
        uVar15 = uVar15 + 1;
      } while (iVar2 == 0);
    }
    iVar16 = 1 << (bVar4 & 0x1f);
    uVar14 = iVar16 - 1;
    iVar7 = 0;
    uVar6 = 0xffffffff;
    while( true ) {
      uVar11 = uVar13 & uVar14;
      uVar5 = (int)uVar15 - tbl_bits;
      iVar8 = iVar16;
      if (uVar11 != uVar6) {
        piVar10 = cnt + (long)tbl_bits + (long)(int)uVar5 + 1;
        uVar6 = uVar5;
        for (iVar7 = iVar2; iVar8 = 1 << ((byte)uVar6 & 0x1f), iVar7 < iVar8;
            iVar7 = iVar7 * 2 + iVar8) {
          iVar8 = *piVar10;
          piVar10 = piVar10 + 1;
          uVar6 = uVar6 + 1;
        }
        tbl[uVar11] = (uVar6 & 0xf) + iVar16 * 0x10000 + 0x10;
        iVar8 = iVar8 + iVar16;
        uVar6 = uVar11;
        iVar7 = iVar16;
      }
      iVar16 = iVar8;
      uVar1 = *puVar12;
      lVar9 = (long)(((int)uVar13 >> (bVar4 & 0x1f)) + iVar7);
      do {
        tbl[lVar9] = uVar5 & 0xf | (uint)uVar1 << 0x10;
        lVar9 = lVar9 + (1 << ((byte)uVar5 & 0x1f));
      } while (lVar9 < iVar16);
      uVar5 = ~(-1 << ((byte)uVar15 & 0x1f));
      if (uVar13 == uVar5) break;
      puVar12 = puVar12 + 1;
      uVar5 = uVar5 ^ uVar13;
      iVar8 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      uVar5 = 1 << ((byte)iVar8 & 0x1f);
      iVar2 = iVar2 + -1;
      piVar10 = cnt + (long)(int)uVar15 + 1;
      while (iVar2 == 0) {
        uVar15 = (ulong)((int)uVar15 + 1);
        iVar2 = *piVar10;
        piVar10 = piVar10 + 1;
      }
      uVar13 = uVar5 - 1 & uVar13 | uVar5;
    }
  }
  return;
}

Assistant:

static void
sinfl_build(unsigned *tbl, unsigned char *lens, int tbl_bits, int maxlen,
            int symcnt) {
  int i, used = 0;
  short sort[288];
  int cnt[16] = {0}, off[16]= {0};
  struct sinfl_gen gen = {0};
  gen.sorted = sort;
  gen.len = 1;

  for (i = 0; i < symcnt; ++i)
    cnt[lens[i]]++;
  off[1] = cnt[0];
  for (i = 1; i < maxlen; ++i) {
    off[i + 1] = off[i] + cnt[i];
    used = (used << 1) + cnt[i];
  }
  used = (used << 1) + cnt[i];
  for (i = 0; i < symcnt; ++i)
    gen.sorted[off[lens[i]]++] = (short)i;
  gen.sorted += off[0];

  if (used < (1 << maxlen)){
    for (i = 0; i < 1 << tbl_bits; ++i)
      tbl[i] = (0 << 16u) | 1;
    return;
  }
  if (!sinfl_build_tbl(&gen, tbl, tbl_bits, cnt)){
    sinfl_build_subtbl(&gen, tbl, tbl_bits, cnt);
  }
}